

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pf_buffermgr.cc
# Opt level: O0

void __thiscall PF_BufferMgr::~PF_BufferMgr(PF_BufferMgr *this)

{
  char *pcVar1;
  StatisticsMgr *pSVar2;
  int local_14;
  int i;
  PF_BufferMgr *this_local;
  
  for (local_14 = 0; local_14 < this->numPages; local_14 = local_14 + 1) {
    pcVar1 = this->bufTable[local_14].pData;
    if (pcVar1 != (char *)0x0) {
      operator_delete__(pcVar1);
    }
  }
  if (this->bufTable != (PF_BufPageDesc *)0x0) {
    operator_delete__(this->bufTable);
  }
  pSVar2 = pStatisticsMgr;
  if (pStatisticsMgr != (StatisticsMgr *)0x0) {
    StatisticsMgr::~StatisticsMgr(pStatisticsMgr);
    operator_delete(pSVar2);
  }
  PF_HashTable::~PF_HashTable(&this->hashTable);
  return;
}

Assistant:

PF_BufferMgr::~PF_BufferMgr()
{
   // Free up buffer pages and tables
   for (int i = 0; i < this->numPages; i++)
      delete [] bufTable[i].pData;

   delete [] bufTable;

#ifdef PF_STATS
   // Destroy the global statistics manager
   delete pStatisticsMgr;
#endif

#ifdef PF_LOG
   WriteLog("Destroyed the buffer manager.\n");
#endif
}